

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O0

SRC_STATE *
src_callback_new(src_callback_t func,int converter_type,int channels,int *error,void *cb_data)

{
  SRC_STATE *state;
  void *cb_data_local;
  int *error_local;
  int channels_local;
  int converter_type_local;
  src_callback_t func_local;
  
  if (func == (src_callback_t)0x0) {
    if (error != (int *)0x0) {
      *error = 0x11;
    }
    func_local = (src_callback_t)0x0;
  }
  else {
    if (error != (int *)0x0) {
      *error = 0;
    }
    func_local = (src_callback_t)src_new(converter_type,channels,error);
    if ((SRC_STATE *)func_local == (SRC_STATE *)0x0) {
      func_local = (src_callback_t)0x0;
    }
    else {
      src_reset((SRC_STATE *)func_local);
      ((SRC_STATE *)func_local)->mode = SRC_MODE_CALLBACK;
      ((SRC_STATE *)func_local)->callback_func = func;
      ((SRC_STATE *)func_local)->user_callback_data = cb_data;
    }
  }
  return (SRC_STATE *)func_local;
}

Assistant:

SRC_STATE*
src_callback_new (src_callback_t func, int converter_type, int channels, int *error, void* cb_data)
{	SRC_STATE	*state ;

	if (func == NULL)
	{	if (error)
			*error = SRC_ERR_BAD_CALLBACK ;
		return NULL ;
		} ;

	if (error != NULL)
		*error = 0 ;

	if ((state = src_new (converter_type, channels, error)) == NULL)
		return NULL ;

	src_reset (state) ;

	state->mode = SRC_MODE_CALLBACK ;
	state->callback_func = func ;
	state->user_callback_data = cb_data ;

	return state ;
}